

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

put_transaction<void>_conflict * __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::try_start_dyn_push_move
          (put_transaction<void>_conflict *__return_storage_ptr__,
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          *this,progress_guarantee i_progress_guarantee,runtime_type *i_type,void *i_source)

{
  size_t i_size;
  size_t i_alignment;
  put_transaction<void> local_a8;
  runtime_type<> *local_78;
  runtime_type<> *type_storage;
  runtime_type *type;
  undefined1 local_48 [8];
  Allocation push_data;
  void *i_source_local;
  runtime_type *i_type_local;
  progress_guarantee i_progress_guarantee_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  push_data.m_user_storage = i_source;
  i_size = runtime_type<>::size(i_type);
  i_alignment = runtime_type<>::alignment(i_type);
  detail::
  LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  ::try_inplace_allocate
            ((Allocation *)local_48,
             (LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
              *)this,i_progress_guarantee,1,true,i_size,i_alignment);
  if (push_data.m_next_ptr == 0) {
    memset(&type,0,0x20);
    put_transaction<void>::put_transaction((put_transaction<void> *)&type);
    lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
    ::put_transaction<void>::put_transaction<void,void>
              ((put_transaction<void> *)__return_storage_ptr__,(put_transaction<void> *)&type);
    put_transaction<void>::~put_transaction((put_transaction<void> *)&type);
  }
  else {
    type_storage = (runtime_type<> *)0x0;
    local_78 = detail::
               LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
               ::type_after_control((ControlBlock *)local_48);
    local_78->m_feature_table = i_type->m_feature_table;
    type_storage = local_78;
    runtime_type<>::move_construct(i_type,(void *)push_data.m_next_ptr,push_data.m_user_storage);
    put_transaction<void>::put_transaction(&local_a8,0,this,(Allocation *)local_48);
    lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
    ::put_transaction<void>::put_transaction<void,void>
              ((put_transaction<void> *)__return_storage_ptr__,&local_a8);
    put_transaction<void>::~put_transaction(&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

put_transaction<> try_start_dyn_push_move(
          progress_guarantee i_progress_guarantee, const runtime_type & i_type, void * i_source)
        {
            auto push_data = try_inplace_allocate(
              i_progress_guarantee, detail::LfQueue_Busy, true, i_type.size(), i_type.alignment());
            if (push_data.m_user_storage == nullptr)
            {
                return put_transaction<>();
            }

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(i_type);

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                i_type.move_construct(push_data.m_user_storage, i_source);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<void>(PrivateType(), this, push_data);
        }